

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O2

void __thiscall Json::Value::CommentInfo::setComment(CommentInfo *this,char *text,size_t len)

{
  char *pcVar1;
  ostringstream oss;
  string local_1b0;
  string local_190 [11];
  
  if (this->comment_ != (char *)0x0) {
    free(this->comment_);
    this->comment_ = (char *)0x0;
  }
  if (text != (char *)0x0) {
    if ((*text != '\0') && (*text != '/')) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
      std::operator<<((ostream *)local_190,
                      "in Json::Value::setComment(): Comments must start with /");
      std::__cxx11::stringbuf::str();
      throwLogicError(&local_1b0);
    }
    pcVar1 = duplicateStringValue(text,len);
    this->comment_ = pcVar1;
    return;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_190,"assert json failed",(allocator<char> *)&local_1b0);
  throwLogicError(local_190);
}

Assistant:

void Value::CommentInfo::setComment(const char* text, size_t len) {
  if (comment_) {
    releaseStringValue(comment_, 0u);
    comment_ = 0;
  }
  JSON_ASSERT(text != 0);
  JSON_ASSERT_MESSAGE(
      text[0] == '\0' || text[0] == '/',
      "in Json::Value::setComment(): Comments must start with /");
  // It seems that /**/ style comments are acceptable as well.
  comment_ = duplicateStringValue(text, len);
}